

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O1

bool __thiscall Clasp::SatBuilder::addConstraint(SatBuilder *this,WeightLitVec *lits,weight_t bound)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  CPair CVar5;
  WeightLitsRep rep;
  WeightLitsRep local_38;
  
  bVar3 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  if (bVar3) {
    WeightLitsRep::create
              (&local_38,*(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf,lits,bound);
    if (((0 < local_38.bound) && (local_38.bound <= local_38.reach)) && ((ulong)local_38.size != 0))
    {
      lVar4 = 0;
      do {
        uVar2 = *(uint *)((long)&((local_38.lits)->first).rep_ + lVar4);
        pbVar1 = (this->varState_).ebo_.buf + (uVar2 >> 2);
        *pbVar1 = *pbVar1 | ((byte)uVar2 & 2) * '\x02' + 4;
        lVar4 = lVar4 + 8;
      } while ((ulong)local_38.size << 3 != lVar4);
    }
    CVar5 = WeightConstraint::create
                      (*(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf,(Literal)0x0,
                       &local_38,0);
    bVar3 = CVar5.con[1] != (WeightConstraint *)0x1 && CVar5.con[0] != (WeightConstraint *)0x1;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool SatBuilder::addConstraint(WeightLitVec& lits, weight_t bound) {
	if (!ctx()->ok()) { return false; }
	WeightLitsRep rep = WeightLitsRep::create(*ctx()->master(), lits, bound);
	if (rep.open()) {
		for (const WeightLiteral* x = rep.lits, *end = rep.lits + rep.size; x != end; ++x) {
			markOcc(x->first);
		}
	}
	return WeightConstraint::create(*ctx()->master(), lit_true(), rep, 0u).ok();
}